

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::ClearInputCharacters(ImGuiIO *this)

{
  ImVector<unsigned_short>::resize(&this->InputQueueCharacters,0);
  return;
}

Assistant:

void ImGuiIO::ClearInputCharacters()
{
    InputQueueCharacters.resize(0);
}